

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

appender fmt::v10::detail::
         do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>
                   (appender out,decimal_fp<float> *f,format_specs<char> *specs,float_specs fspecs,
                   locale_ref loc)

{
  float_specs fVar1;
  char cVar2;
  byte bVar3;
  int iVar4;
  numpunct *pnVar5;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> bVar6;
  appender aVar7;
  undefined8 uVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  undefined8 uVar14;
  uint uVar15;
  long lVar16;
  size_t sVar17;
  bool bVar18;
  char decimal_point;
  sign_t sign;
  char zero;
  bool pointy;
  int significand_size;
  significand_type significand;
  int exp;
  anon_class_28_8_ad0ecca5 write;
  int num_zeros;
  undefined1 local_e7 [2];
  undefined1 local_e5 [5];
  float_specs local_e0;
  int local_d4;
  float_specs local_d0;
  undefined1 local_c8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  _Alloc_hider local_a8;
  float_specs *local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  char *local_88;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_80;
  decimal_fp<float> *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  digit_grouping<char> *local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  local_d0.precision = f->significand;
  uVar15 = 0x1f;
  if ((local_d0.precision | 1U) != 0) {
    for (; (local_d0.precision | 1U) >> uVar15 == 0; uVar15 = uVar15 - 1) {
    }
  }
  uVar11 = (ulong)(uint)local_d0.precision +
           *(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar15 * 8);
  local_d4 = (int)(uVar11 >> 0x20);
  local_e5[0] = '0';
  local_e0._4_4_ = fspecs._4_4_;
  local_e7[1] = fspecs._5_1_;
  fVar1 = fspecs;
  if (-1 < (long)uVar11) {
    bVar18 = local_e7[1] != none;
    cVar2 = '.';
    uVar15 = (uint)local_e0._4_4_ >> 0x11;
    local_e0 = fspecs;
    if ((uVar15 & 1) != 0) {
      local_80 = out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container;
      local_78 = f;
      if (loc.locale_ == (void *)0x0) {
        std::locale::locale((locale *)local_c8);
      }
      else {
        std::locale::locale((locale *)local_c8,(locale *)loc.locale_);
      }
      pnVar5 = std::use_facet<std::__cxx11::numpunct<char>>((locale *)local_c8);
      cVar2 = (**(code **)(*(long *)pnVar5 + 0x10))(pnVar5);
      std::locale::~locale((locale *)local_c8);
      out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container = local_80;
      f = local_78;
    }
    uVar8 = local_b8._M_allocated_capacity;
    lVar16 = (uVar11 >> 0x20) + (ulong)bVar18;
    uVar15 = f->exponent;
    local_d0._4_4_ = local_d4 + uVar15;
    iVar13 = local_e0.precision;
    local_e7[0] = cVar2;
    if (local_e0._4_1_ == '\x01') {
LAB_00134078:
      iVar10 = uVar15 + local_d4 + -1;
      if (((uint)local_e0._4_4_ >> 0x13 & 1) == 0) {
        uVar11 = 0;
        if (local_d4 == 1) {
          local_e7[0] = '\0';
        }
      }
      else {
        uVar11 = 0;
        if (0 < iVar13 - local_d4) {
          uVar11 = (ulong)(uint)(iVar13 - local_d4);
        }
        lVar16 = lVar16 + uVar11;
      }
      local_c8[0] = local_e7[1];
      local_c8._4_4_ = local_d0.precision;
      local_c8[0xc] = local_e7[0];
      local_c8._8_4_ = local_d4;
      local_b8._M_allocated_capacity._0_5_ = CONCAT14('0',(int)uVar11);
      local_b8._M_allocated_capacity._6_2_ = SUB82(uVar8,6);
      local_b8._M_allocated_capacity =
           CONCAT26(local_b8._M_allocated_capacity._6_2_,
                    CONCAT15((((uint)local_e0._4_4_ >> 0x10 & 1) == 0) << 5,
                             local_b8._M_allocated_capacity._0_5_)) | 0x450000000000;
      local_b8._8_4_ = iVar10;
      if (0 < specs->width) {
        if ((int)local_d0._4_4_ < 1) {
          iVar10 = 1 - local_d0._4_4_;
        }
        lVar12 = 2;
        if (99 < iVar10) {
          lVar12 = (ulong)(999 < iVar10) + 3;
        }
        sVar17 = lVar16 + lVar12 + (3 - (ulong)(local_e7[0] == '\0'));
        aVar7 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_1_&>
                          (out,specs,sVar17,sVar17,(anon_class_28_8_ad0ecca5 *)local_c8);
        return (appender)
               aVar7.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container
        ;
      }
      aVar7 = do_write_float<fmt::v10::appender,_fmt::v10::detail::dragonbox::decimal_fp<float>,_char,_fmt::v10::detail::digit_grouping<char>_>
              ::anon_class_28_8_ad0ecca5::operator()
                        ((anon_class_28_8_ad0ecca5 *)local_c8,
                         (iterator)
                         out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container);
      return (appender)
             aVar7.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.container;
    }
    if (((ulong)local_e0 & 0xff00000000) == 0) {
      iVar10 = 0x10;
      if (0 < iVar13) {
        iVar10 = iVar13;
      }
      if (((int)local_d0._4_4_ < -3) || (iVar10 < (int)local_d0._4_4_)) goto LAB_00134078;
    }
    if ((int)uVar15 < 0) {
      if ((int)local_d0._4_4_ < 1) {
        iVar4 = -local_d0._4_4_;
        iVar10 = iVar4;
        if (SBORROW4(iVar13,iVar4) != iVar13 + local_d0._4_4_ < 0) {
          iVar10 = iVar13;
        }
        if (iVar13 < 0) {
          iVar10 = iVar4;
        }
        if (local_d4 != 0) {
          iVar10 = iVar4;
        }
        local_70._M_allocated_capacity._0_4_ = iVar10;
        bVar3 = 1;
        if (local_d4 == 0 && iVar10 == 0) {
          bVar3 = (local_e0._6_1_ & 8) >> 3;
        }
        local_e5[1] = bVar3;
        fVar1 = local_e0;
        if (-1 < iVar10) {
          sVar17 = lVar16 + (ulong)((uint)bVar3 + iVar10 + 1);
          local_c8._0_8_ = local_e7 + 1;
          local_c8._8_8_ = local_e7 + 2;
          local_b8._M_allocated_capacity = (size_type)(local_e7 + 3);
          local_b8._8_8_ = local_e7;
          local_a8._M_p = (pointer)&local_70;
          local_a0 = &local_d0;
          local_98._M_allocated_capacity = (size_type)&local_d4;
          aVar7 = write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_4_&>
                            (out,specs,sVar17,sVar17,(anon_class_56_7_162c6e41 *)local_c8);
          return (appender)
                 aVar7.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container.
                 container;
        }
        goto LAB_0013444b;
      }
      uVar15 = iVar13 - local_d4 & (int)(local_e0._4_4_ << 0xc) >> 0x1f;
      local_e5._1_4_ = uVar15;
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)local_c8,loc,
                 (bool)((byte)((uint)local_e0._4_4_ >> 0x11) & 1));
      iVar13 = 0;
      if ((int)uVar15 < 1) {
        uVar15 = 0;
      }
      sVar17 = (ulong)uVar15 + (uVar11 >> 0x20) + (ulong)bVar18;
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_c8._0_8_;
      do {
        iVar10 = 0x7fffffff;
        if (local_a0 != (float_specs *)0x0) {
          if (paVar9 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_c8._0_8_ + (long)(int *)local_c8._8_8_)) {
            uVar15 = (uint)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_c8._0_8_ + (long)(int *)local_c8._8_8_))->_M_local_buf[-1];
          }
          else {
            bVar3 = paVar9->_M_local_buf[0];
            if ((byte)(bVar3 + 0x81) < 0x82) goto LAB_00134307;
            paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar9->_M_local_buf + 1);
            uVar15 = (uint)bVar3;
          }
          iVar13 = iVar13 + uVar15;
          iVar10 = iVar13;
        }
LAB_00134307:
        sVar17 = sVar17 + 1;
      } while (iVar10 < (int)local_d0._4_4_);
      local_70._M_allocated_capacity = (size_type)(local_e7 + 1);
      local_70._8_8_ = &local_d0;
      local_60._M_allocated_capacity = (size_type)&local_d4;
      local_60._8_8_ = &local_d0.field_0x4;
      local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_e7;
      local_40._M_allocated_capacity = (size_type)(local_e7 + 3);
      local_40._8_8_ = local_e7 + 2;
      local_48 = (digit_grouping<char> *)local_c8;
      bVar6.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_3_&>
                     (out,specs,sVar17,sVar17,(anon_class_64_8_e6ffa566 *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_p != &local_98) {
        operator_delete(local_a8._M_p,(ulong)(local_98._M_allocated_capacity + 1));
      }
      uVar8 = local_b8._M_allocated_capacity;
      uVar14 = local_c8._0_8_;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._0_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_c8 + 0x10)) {
        return (appender)bVar6.container;
      }
    }
    else {
      lVar16 = lVar16 + (ulong)uVar15;
      local_e5._1_4_ = iVar13 - local_d0._4_4_;
      if (((uint)local_e0._4_4_ >> 0x13 & 1) != 0) {
        if (local_e0._4_1_ != '\x02' && (int)local_e5._1_4_ < 1) {
          local_e5._1_4_ = 0;
        }
        lVar16 = lVar16 + 1;
        if (0 < (long)(int)local_e5._1_4_) {
          lVar16 = lVar16 + (int)local_e5._1_4_;
        }
      }
      digit_grouping<char>::digit_grouping
                ((digit_grouping<char> *)&local_70,loc,
                 (bool)((byte)((uint)local_e0._4_4_ >> 0x11) & 1));
      sVar17 = lVar16 - 1;
      iVar13 = 0;
      uVar8 = local_70._M_allocated_capacity;
      do {
        iVar10 = 0x7fffffff;
        if (local_48 != (digit_grouping<char> *)0x0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)uVar8 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_70._M_allocated_capacity + local_70._8_8_)) {
            uVar15 = (uint)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_70._M_allocated_capacity + local_70._8_8_))->_M_local_buf[-1];
          }
          else {
            bVar3 = *(byte *)uVar8;
            if ((byte)(bVar3 + 0x81) < 0x82) goto LAB_001341b3;
            uVar8 = uVar8 + 1;
            uVar15 = (uint)bVar3;
          }
          iVar13 = iVar13 + uVar15;
          iVar10 = iVar13;
        }
LAB_001341b3:
        sVar17 = sVar17 + 1;
      } while (iVar10 < (int)local_d0._4_4_);
      local_c8._0_8_ = local_e7 + 1;
      local_c8._8_8_ = &local_d0;
      local_b8._M_allocated_capacity = (size_type)&local_d4;
      local_a0 = &local_e0;
      local_98._M_allocated_capacity = (size_type)local_e7;
      local_98._8_8_ = local_e7 + 3;
      local_88 = local_e7 + 2;
      local_b8._8_8_ = f;
      local_a8._M_p = (pointer)&local_70;
      bVar6.container =
           (buffer<char> *)
           write_padded<(fmt::v10::align::type)2,fmt::v10::appender,char,fmt::v10::detail::do_write_float<fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>,char,fmt::v10::detail::digit_grouping<char>>(fmt::v10::appender,fmt::v10::detail::dragonbox::decimal_fp<float>const&,fmt::v10::format_specs<char>const&,fmt::v10::detail::float_specs,fmt::v10::detail::locale_ref)::_lambda(fmt::v10::appender)_2_&>
                     (out,specs,sVar17,sVar17,(anon_class_72_9_0c6a3a8a *)local_c8);
      if (local_50 != &local_40) {
        operator_delete(local_50,(ulong)(local_40._M_allocated_capacity + 1));
      }
      uVar8 = local_60._M_allocated_capacity;
      uVar14 = local_70._M_allocated_capacity;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_allocated_capacity == &local_60) {
        return (appender)bVar6.container;
      }
    }
    operator_delete((void *)uVar14,uVar8 + 1);
    return (appender)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)bVar6.container;
  }
LAB_0013444b:
  local_e0 = fVar1;
  assert_fail("/workspace/llm4binary/github/license_c_cmakelists/oneapi-src[P]level-zero/third_party/spdlog_headers/spdlog/fmt/bundled/core.h"
              ,0x189,"negative value");
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& f,
                                    const format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = f.significand;
  int significand_size = get_significand_size(f);
  const Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = f.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = f.exponent + significand_size;
  if (f.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(f.exponent);
    int num_zeros = fspecs.precision - exp;
    abort_fuzzing_if(num_zeros > 5000);
    if (fspecs.showpoint) {
      ++size;
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 0;
      if (num_zeros > 0) size += to_unsigned(num_zeros);
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   f.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(exp));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}